

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O1

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int8_t *piVar4;
  int8_t *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  cfg->tx_size = tx_size;
  iVar7 = 0;
  iVar9 = 0;
  if (tx_type < 0x10) {
    iVar7 = *(int *)(&DAT_0056e574 + (uint)tx_type * 4);
    iVar9 = *(int *)(&DAT_0056e5b4 + (uint)tx_type * 4);
  }
  cfg->ud_flip = iVar7;
  cfg->lr_flip = iVar9;
  bVar1 = ""[tx_type];
  bVar2 = ""[tx_type];
  lVar12 = (long)*(int *)((long)tx_size_wide_log2 + (ulong)((uint)tx_size * 4));
  lVar8 = (long)*(int *)((long)tx_size_high_log2 + (ulong)((uint)tx_size * 4));
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  lVar6 = lVar12 * 5;
  cfg->cos_bit_col = ""[lVar8 + lVar6 + 1];
  cfg->cos_bit_row = *(int8_t *)(lVar8 + lVar6 + 0x56e3c4);
  bVar1 = *(byte *)((ulong)bVar1 + lVar8 * 4 + 0x521a98);
  cfg->txfm_type_col = bVar1;
  bVar2 = *(byte *)((ulong)bVar2 + lVar12 * 4 + 0x521a98);
  cfg->txfm_type_row = bVar2;
  cVar3 = "\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar1];
  iVar7 = (int)cVar3;
  cfg->stage_num_col = iVar7;
  cfg->stage_num_row = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar2];
  cfg->stage_range_col[0] = '\0';
  cfg->stage_range_col[1] = '\0';
  cfg->stage_range_col[2] = '\0';
  cfg->stage_range_col[3] = '\0';
  cfg->stage_range_col[4] = '\0';
  cfg->stage_range_col[5] = '\0';
  cfg->stage_range_col[6] = '\0';
  cfg->stage_range_col[7] = '\0';
  *(undefined8 *)(cfg->stage_range_col + 8) = 0;
  cfg->stage_range_row[4] = '\0';
  cfg->stage_range_row[5] = '\0';
  cfg->stage_range_row[6] = '\0';
  cfg->stage_range_row[7] = '\0';
  cfg->stage_range_row[8] = '\0';
  cfg->stage_range_row[9] = '\0';
  cfg->stage_range_row[10] = '\0';
  cfg->stage_range_row[0xb] = '\0';
  piVar4 = fwd_txfm_range_mult2_list[bVar1];
  if ('\0' < cVar3) {
    uVar10 = 0xb;
    if (iVar7 - 1U < 0xb) {
      uVar10 = iVar7 - 1U;
    }
    uVar13 = 0;
    do {
      cfg->stage_range_col[uVar13] = (int8_t)((int)piVar4[uVar13] + 1U >> 1);
      uVar13 = uVar13 + 1;
    } while (uVar10 + 1 != uVar13);
  }
  if (0 < cfg->stage_num_row) {
    piVar5 = fwd_txfm_range_mult2_list[cfg->txfm_type_row];
    uVar11 = cfg->stage_num_row - 1;
    uVar10 = 0xb;
    if (uVar11 < 0xb) {
      uVar10 = uVar11;
    }
    uVar13 = 0;
    do {
      cfg->stage_range_row[uVar13] =
           (int8_t)((int)piVar4[(long)iVar7 + -1] + (int)piVar5[uVar13] + 1U >> 1);
      uVar13 = uVar13 + 1;
    } while (uVar10 + 1 != uVar13);
  }
  return;
}

Assistant:

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  cfg->cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  cfg->cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  assert(cfg->txfm_type_col != TXFM_TYPE_INVALID);
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  assert(cfg->txfm_type_row != TXFM_TYPE_INVALID);
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
  set_fwd_txfm_non_scale_range(cfg);
}